

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

void __thiscall
dg::LLVMPointerAnalysis::LLVMPointerAnalysis
          (LLVMPointerAnalysis *this,LLVMPointerAnalysisOptions *opts)

{
  this->_vptr_LLVMPointerAnalysis = (_func_int **)&PTR___cxa_pure_virtual_001406c8;
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions(&this->options,opts);
  return;
}

Assistant:

LLVMPointerAnalysis(LLVMPointerAnalysisOptions opts)
            : options(std::move(opts)){}